

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O1

Option<Catch::SectionTracking::TestCaseTracker> * __thiscall
Catch::Option<Catch::SectionTracking::TestCaseTracker>::operator=
          (Option<Catch::SectionTracking::TestCaseTracker> *this,TestCaseTracker *_value)

{
  pointer pcVar1;
  
  reset(this);
  *(char **)this->storage = this->storage + 0x10;
  pcVar1 = (_value->m_testCase).m_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this->storage,pcVar1,pcVar1 + (_value->m_testCase).m_name._M_string_length);
  *(RunState *)(this->storage + 0x20) = (_value->m_testCase).m_runState;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
              *)(this->storage + 0x28),&(_value->m_testCase).m_children._M_t);
  *(TrackedSection **)(this->storage + 0x58) = (_value->m_testCase).m_parent;
  *(TrackedSection **)(this->storage + 0x60) = _value->m_currentSection;
  this->storage[0x68] = _value->m_completedASectionThisRun;
  this->nullableValue = (TestCaseTracker *)this->storage;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }